

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

bool google::InitVLOG3__(int32 **site_flag,int32 *site_default,char *fname,int32 verbose_level)

{
  undefined8 *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  char *pcVar7;
  string *psVar8;
  string *psVar9;
  string *psVar10;
  ulong str_len;
  long *plVar11;
  undefined4 local_6c;
  char *local_68;
  int *local_60;
  int32 **local_58;
  string pattern;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)vmodule_lock);
  cVar2 = inited_vmodule;
  if (inited_vmodule == '\0') {
    inited_vmodule = 0;
    pcVar7 = (char *)*fLS::FLAGS_vmodule_abi_cxx11_;
    psVar10 = (string *)0x0;
    psVar8 = (string *)0x0;
    local_68 = fname;
    local_60 = site_default;
    local_58 = site_flag;
    do {
      pcVar5 = strchr(pcVar7,0x3d);
      psVar9 = psVar8;
      if (pcVar5 == (char *)0x0) break;
      pattern._M_dataplus._M_p = (pointer)&pattern.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pattern,pcVar7,pcVar5);
      iVar4 = __isoc99_sscanf(pcVar5,"=%d",&local_6c);
      psVar6 = psVar10;
      if (iVar4 == 1) {
        psVar6 = (string *)operator_new(0x30);
        *(string **)psVar6 = psVar6 + 0x10;
        *(undefined8 *)(psVar6 + 8) = 0;
        psVar6[0x10] = (string)0x0;
        std::__cxx11::string::_M_assign(psVar6);
        *(undefined4 *)(psVar6 + 0x20) = local_6c;
        psVar9 = psVar6;
        if (psVar8 != (string *)0x0) {
          *(string **)(psVar10 + 0x28) = psVar6;
          psVar9 = psVar8;
        }
      }
      psVar10 = psVar6;
      pcVar5 = strchr(pcVar5,0x2c);
      pcVar7 = pcVar5 + 1;
      std::__cxx11::string::~string((string *)&pattern);
      psVar8 = psVar9;
    } while (pcVar5 != (char *)0x0);
    if (psVar9 != (string *)0x0) {
      *(string **)(psVar10 + 0x28) = vmodule_list;
      vmodule_list = psVar9;
    }
    inited_vmodule = '\x01';
    site_flag = local_58;
    site_default = local_60;
    fname = local_68;
  }
  pcVar5 = strrchr(fname,0x2f);
  pcVar7 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar7 = fname;
  }
  pcVar5 = strchr(pcVar7,0x2e);
  if (pcVar5 == (char *)0x0) {
    str_len = strlen(pcVar7);
  }
  else {
    str_len = (long)pcVar5 - (long)pcVar7;
  }
  if ((3 < str_len) && (*(int *)(pcVar7 + (str_len - 4)) == 0x6c6e692d)) {
    str_len = str_len - 4;
  }
  plVar11 = (long *)&vmodule_list;
  do {
    puVar1 = (undefined8 *)*plVar11;
    if (puVar1 == (undefined8 *)0x0) {
LAB_0011cebf:
      if (cVar2 != '\0') {
        *site_flag = site_default;
      }
      iVar4 = *site_default;
      ::glog_internal_namespace_::Mutex::Unlock((Mutex *)vmodule_lock);
      return verbose_level <= iVar4;
    }
    bVar3 = glog_internal_namespace_::SafeFNMatch_((char *)*puVar1,puVar1[1],pcVar7,str_len);
    if (bVar3) {
      site_default = (int32 *)(puVar1 + 4);
      goto LAB_0011cebf;
    }
    plVar11 = puVar1 + 5;
  } while( true );
}

Assistant:

bool InitVLOG3__(int32** site_flag, int32* site_default,
                 const char* fname, int32 verbose_level) {
  MutexLock l(&vmodule_lock);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = site_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');
  base = base ? (base+1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length = base_end ? size_t(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base+base_length-4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list;
       info != NULL; info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
        // value at info->vlog_level is now what controls
        // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) *site_flag = site_flag_value;

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}